

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O2

unique_ptr<llbuild::buildsystem::Command,_std::default_delete<llbuild::buildsystem::Command>_>
__thiscall
anon_unknown.dwarf_2cfb1b::SwiftCompilerTool::createCustomCommand
          (SwiftCompilerTool *this,BuildKey *key)

{
  int iVar1;
  Command *this_00;
  BuildKey *in_RDX;
  StringRef SVar2;
  StringRef local_30;
  
  SVar2 = llbuild::buildsystem::BuildKey::getCustomTaskName(in_RDX);
  if (SVar2.Length == 0x11) {
    iVar1 = bcmp(SVar2.Data,"swift-get-version",0x11);
    if (iVar1 == 0) {
      this_00 = (Command *)operator_new(0x80);
      SVar2.Length = 0x11;
      SVar2.Data = "swift-get-version";
      llbuild::buildsystem::Command::Command(this_00,SVar2);
      (this_00->super_JobDescriptor)._vptr_JobDescriptor =
           (_func_int **)&PTR__SwiftGetVersionCommand_0022d2f8;
      local_30 = llbuild::buildsystem::BuildKey::getCustomTaskData(in_RDX);
      llvm::StringRef::str_abi_cxx11_((string *)(this_00 + 1),&local_30);
      goto LAB_0017d960;
    }
  }
  this_00 = (Command *)0x0;
LAB_0017d960:
  (this->super_Tool)._vptr_Tool = (_func_int **)this_00;
  return (__uniq_ptr_data<llbuild::buildsystem::Command,_std::default_delete<llbuild::buildsystem::Command>,_true,_true>
          )(__uniq_ptr_data<llbuild::buildsystem::Command,_std::default_delete<llbuild::buildsystem::Command>,_true,_true>
            )this;
}

Assistant:

virtual std::unique_ptr<Command> createCustomCommand(
      const BuildKey& key) override {
    if (key.getCustomTaskName() == "swift-get-version" ) {
      return llvm::make_unique<SwiftGetVersionCommand>(key);
    }

    return nullptr;
  }